

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void vera::texelCoordToVec(float *_out3f,float _u,float _v,uint8_t _faceId)

{
  float fVar1;
  float invLen;
  uint8_t _faceId_local;
  float _v_local;
  float _u_local;
  float *_out3f_local;
  
  *_out3f = *(float *)(cubemapUV + (ulong)_faceId * 0x24) * _u +
            *(float *)(cubemapUV + (ulong)_faceId * 0x24 + 0xc) * _v +
            *(float *)(cubemapUV + (ulong)_faceId * 0x24 + 0x18);
  _out3f[1] = *(float *)(cubemapUV + (ulong)_faceId * 0x24 + 4) * _u +
              *(float *)(cubemapUV + (ulong)_faceId * 0x24 + 0x10) * _v +
              *(float *)(cubemapUV + (ulong)_faceId * 0x24 + 0x1c);
  _out3f[2] = *(float *)(cubemapUV + (ulong)_faceId * 0x24 + 8) * _u +
              *(float *)(cubemapUV + (ulong)_faceId * 0x24 + 0x14) * _v +
              *(float *)(cubemapUV + (ulong)_faceId * 0x24 + 0x20);
  fVar1 = sqrtf(_out3f[2] * _out3f[2] + *_out3f * *_out3f + _out3f[1] * _out3f[1]);
  fVar1 = 1.0 / fVar1;
  *_out3f = fVar1 * *_out3f;
  _out3f[1] = fVar1 * _out3f[1];
  _out3f[2] = fVar1 * _out3f[2];
  return;
}

Assistant:

void texelCoordToVec(float* _out3f, float _u, float _v, uint8_t _faceId) {
    // out = u * s_faceUv[0] + v * s_faceUv[1] + s_faceUv[2].
    _out3f[0] = cubemapUV[_faceId][0][0] * _u + cubemapUV[_faceId][1][0] * _v + cubemapUV[_faceId][2][0];
    _out3f[1] = cubemapUV[_faceId][0][1] * _u + cubemapUV[_faceId][1][1] * _v + cubemapUV[_faceId][2][1];
    _out3f[2] = cubemapUV[_faceId][0][2] * _u + cubemapUV[_faceId][1][2] * _v + cubemapUV[_faceId][2][2];

    // Normalize.
    const float invLen = 1.0f/sqrtf(_out3f[0]*_out3f[0] + _out3f[1]*_out3f[1] + _out3f[2]*_out3f[2]);
    _out3f[0] *= invLen;
    _out3f[1] *= invLen;
    _out3f[2] *= invLen;
}